

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool BicTest3<Blob<128>,Blob<224>>(pfHash hash,int reps,bool verbose)

{
  reference pvVar1;
  int iVar2;
  ulong uVar3;
  byte in_DL;
  int in_ESI;
  code *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool result;
  int i;
  double b2;
  int b_1;
  double bias;
  int *bins_1;
  int *page_1;
  int keybit_1;
  int out2_1;
  int out1_1;
  uint32_t x;
  int *b;
  int out2;
  int out1;
  Blob<224> d;
  int irep;
  int *page;
  int keybit;
  vector<int,_std::allocator<int>_> bins;
  Blob<224> h2;
  Blob<224> h1;
  Blob<128> key;
  int maxB;
  int maxA;
  int maxK;
  double maxBias;
  Rand r;
  int pagesize;
  int hashbits;
  int hashbytes;
  int keybits;
  int keybytes;
  uint32_t in_stack_fffffffffffffeac;
  byte bVar6;
  uint32_t in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb4;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  Blob<224> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  double local_128;
  uint local_110;
  uint local_10c;
  uint local_108;
  int local_f8;
  int local_f4;
  int local_d4;
  int local_c8;
  allocator_type local_b5;
  undefined4 local_b4;
  vector<int,_std::allocator<int>_> local_b0;
  Blob<224> local_94;
  Blob<224> local_78;
  Blob<128> local_5c;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_d;
  int local_c;
  code *local_8;
  
  local_d = in_DL & 1;
  local_14 = 0x10;
  local_18 = 0x80;
  local_1c = 0x1c;
  local_20 = 0xe0;
  local_24 = 0x31000;
  local_c = in_ESI;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeac);
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  Blob<128>::Blob(&local_5c);
  Blob<224>::Blob(&local_78);
  Blob<224>::Blob(&local_94);
  local_b4 = 0;
  __a = &local_b5;
  std::allocator<int>::allocator((allocator<int> *)0x18bebb);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (size_type)in_stack_fffffffffffffec8,
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             __a);
  std::allocator<int>::~allocator((allocator<int> *)0x18bee9);
  for (local_c8 = 0; local_c8 < 0x80; local_c8 = local_c8 + 1) {
    if (local_c8 % 0xc == 0) {
      printf(".");
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&local_b0,(long)(local_c8 * 0x31000));
    for (local_d4 = 0; local_d4 < local_c; local_d4 = local_d4 + 1) {
      Rand::rand_p((Rand *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      (*local_8)(&local_5c,0x10,0,&local_78);
      flipbit<Blob<128>>((Blob<128> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffeac);
      (*local_8)(&local_5c,0x10,0,&local_94);
      Blob<224>::operator^
                (in_stack_fffffffffffffec8,
                 (Blob<224> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      for (local_f4 = 0; local_f8 = local_f4, local_f4 < 0xdf; local_f4 = local_f4 + 1) {
        while (local_f8 = local_f8 + 1, local_f8 < 0xe0) {
          iVar2 = local_f4 * 0xe0 + local_f8;
          in_stack_fffffffffffffeb4 =
               getbit<Blob<224>>((Blob<224> *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffeac);
          in_stack_fffffffffffffeb0 =
               getbit<Blob<224>>((Blob<224> *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffeac);
          uVar3 = (ulong)(in_stack_fffffffffffffeb4 | in_stack_fffffffffffffeb0 << 1);
          pvVar1[(long)(iVar2 * 4) + uVar3] = pvVar1[(long)(iVar2 * 4) + uVar3] + 1;
        }
      }
    }
  }
  printf("\n");
  for (local_108 = 0; local_10c = local_108, (int)local_108 < 0xdf; local_108 = local_108 + 1) {
    while (local_10c = local_10c + 1, (int)local_10c < 0xe0) {
      if ((local_d & 1) != 0) {
        printf("(%3d,%3d) - ",(ulong)local_108,(ulong)local_10c);
      }
      for (local_110 = 0; (int)local_110 < 0x80; local_110 = local_110 + 1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_b0,(long)(int)(local_110 * 0x31000));
        local_128 = 0.0;
        for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (double)pvVar1[(long)(int)((local_108 * 0xe0 + local_10c) * 4) +
                                        (long)iVar2] / (double)(local_c / 2);
          auVar4 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar4,ZEXT816(0xbff0000000000000));
          auVar5._8_8_ = 0x7fffffffffffffff;
          auVar5._0_8_ = 0x7fffffffffffffff;
          auVar4 = vpand_avx(auVar4,auVar5);
          if (local_128 < auVar4._0_8_) {
            local_128 = auVar4._0_8_;
          }
        }
        if (local_40 < local_128) {
          local_40 = local_128;
          local_44 = local_110;
          local_48 = local_108;
          local_4c = local_10c;
        }
        if ((local_d & 1) != 0) {
          if (0.01 <= local_128) {
            if (0.05 <= local_128) {
              if (0.33 <= local_128) {
                printf("X");
              }
              else {
                printf("O");
              }
            }
            else {
              printf("o");
            }
          }
          else {
            printf(".");
          }
        }
      }
      if ((local_d & 1) != 0) {
        printf("\n");
      }
    }
    if ((local_d & 1) != 0) {
      for (in_stack_fffffffffffffec4 = 0; in_stack_fffffffffffffec4 < 0x8c;
          in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
        printf("-");
      }
      printf("\n");
    }
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",local_40,(ulong)local_44,(ulong)local_48,(ulong)local_4c)
  ;
  bVar6 = local_40 < 0.05;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,CONCAT13(bVar6,(int3)in_stack_fffffffffffffec0)));
  return (bool)(bVar6 & 1);
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}